

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64assembler.cpp
# Opt level: O3

uint32_t asmjit::_abi_1_10::a64::encodeMovSequence64
                   (uint32_t *out,uint64_t imm,uint32_t rd,uint32_t x)

{
  uint32_t count;
  uint uVar1;
  uint extraout_EAX;
  uint uVar2;
  ulong uVar3;
  uint extraout_EDX;
  uint uVar4;
  uint32_t op;
  uint uVar5;
  uint uVar6;
  
  uVar4 = (uint)imm;
  if (imm >> 0x20 == 0) {
    uVar2 = x * -0x80000000;
    uVar1 = uVar2 + 0x52800000;
    if (imm < 0x10000) {
      *out = uVar1 | uVar4 << 5 | rd;
      return 1;
    }
    if (0xfffe < imm >> 0x10) {
      uVar4 = ~uVar4 << 5 | rd | 0x12800000;
      goto LAB_001323f8;
    }
  }
  else {
    if ((uint)((imm & 0xffff0000) == 0) + (uint)(imm >> 0x30 == 0) + (uint)((imm & 0xffff) == 0) +
        (uint)((imm & 0xffff00000000) == 0) <
        (uint)((imm & 0xffff00000000) == 0xffff00000000) + (uint)((imm & 0xffff) == 0xffff) +
        ((((uVar4 & 0xffff0000) == 0xffff0000) + 1) - (uint)(imm >> 0x30 < 0xffff))) {
      uVar5 = 0x92800000;
      uVar1 = 0;
      uVar2 = 0xffff;
      uVar4 = 0;
      do {
        uVar6 = (uint)imm & 0xffff;
        if (uVar6 != 0xffff) {
          uVar3 = (ulong)uVar4;
          uVar4 = uVar4 + 1;
          out[uVar3] = uVar1 | rd | uVar5 | (uVar2 ^ uVar6) << 5;
          uVar2 = 0;
          uVar5 = 0xf2800000;
        }
        imm = imm >> 0x10;
        uVar1 = uVar1 + 0x200000;
      } while (uVar1 != 0x800000);
      if (uVar4 == 0) {
        *out = uVar2 << 5 ^ 0x929fffe0 | rd;
        return 1;
      }
      return uVar4;
    }
    uVar1 = 0xd2800000;
    uVar2 = 0;
    uVar4 = 0;
    do {
      if ((imm & 0xffff) != 0) {
        uVar3 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        out[uVar3] = uVar1 | rd | ((uint)imm & 0xffff) * 0x20 + uVar2;
        uVar1 = 0xf2800000;
      }
      imm = imm >> 0x10;
      uVar2 = uVar2 + 0x200000;
    } while (uVar2 != 0x800000);
    if (uVar4 != 0) {
      return uVar4;
    }
    encodeMovSequence64();
    rd = extraout_EDX;
    uVar1 = extraout_EAX;
  }
  uVar4 = (uint)imm;
  if ((short)imm == -1) {
    uVar4 = ~uVar4 >> 0xb | rd | 0x12a00000;
  }
  else {
    if ((imm & 0xffff) != 0) {
      *out = (uVar4 & 0xffff) << 5 | rd | uVar1;
      out[1] = uVar4 >> 0xb & 0xffffffe0 | rd | 0x72a00000;
      return 2;
    }
    uVar4 = uVar4 >> 0xb | rd | uVar2 | 0x52a00000;
  }
LAB_001323f8:
  *out = uVar4;
  return 1;
}

Assistant:

static uint32_t encodeMovSequence64(uint32_t out[4], uint64_t imm, uint32_t rd, uint32_t x) noexcept {
  ASMJIT_ASSERT(rd <= 31);

  uint32_t kMovZ = 0b11010010100000000000000000000000;
  uint32_t kMovN = 0b10010010100000000000000000000000;
  uint32_t kMovK = 0b11110010100000000000000000000000;

  if (imm <= 0xFFFFFFFFu)
    return encodeMovSequence32(out, uint32_t(imm), rd, x);

  uint32_t zhw = countZeroHalfWords64( imm);
  uint32_t ohw = countZeroHalfWords64(~imm);

  if (zhw >= ohw) {
    uint32_t op = kMovZ;
    uint32_t count = 0;

    for (uint32_t hwIndex = 0; hwIndex < 4; hwIndex++, imm >>= 16) {
      uint32_t hwImm = uint32_t(imm & 0xFFFFu);
      if (hwImm == 0)
        continue;

      out[count++] = op | (hwIndex << 21) | (hwImm << 5) | rd;
      op = kMovK;
    }

    // This should not happen - zero should be handled by encodeMovSequence32().
    ASMJIT_ASSERT(count > 0);

    return count;
  }
  else {
    uint32_t op = kMovN;
    uint32_t count = 0;
    uint32_t negMask = 0xFFFFu;

    for (uint32_t hwIndex = 0; hwIndex < 4; hwIndex++, imm >>= 16) {
      uint32_t hwImm = uint32_t(imm & 0xFFFFu);
      if (hwImm == 0xFFFFu)
        continue;

      out[count++] = op | (hwIndex << 21) | ((hwImm ^ negMask) << 5) | rd;
      op = kMovK;
      negMask = 0;
    }

    if (count == 0) {
      out[count++] = kMovN | ((0xFFFF ^ negMask) << 5) | rd;
    }

    return count;
  }
}